

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O1

void __thiscall ConstantExpression::set(ConstantExpression *this,float value)

{
  long lVar1;
  ostringstream builder;
  long *local_1b8 [2];
  long local_1a8 [2];
  long local_198;
  undefined8 local_190 [13];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198,_S_out);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 8;
  std::ostream::_M_insert<double>((double)value);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find((char)local_1b8,0x2e);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  if (lVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,".0",2);
  }
  this->m_isLiteral = false;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_text,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void set( float value )
	{
		std::ostringstream builder(std::ios_base::out);

		builder.precision(8);
		builder << value;

		if (builder.str().find('.') == std::string::npos)
			builder << ".0";

		m_isLiteral = false;
		m_text = builder.str();
	}